

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::clear
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,bool dispose)

{
  Size SVar1;
  int *piVar2;
  int local_18;
  int i;
  bool dispose_local;
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this_local;
  
  local_18 = 0;
  while( true ) {
    SVar1 = vec<int,_int>::size(&this->heap);
    if (SVar1 <= local_18) break;
    piVar2 = vec<int,_int>::operator[](&this->heap,local_18);
    piVar2 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,*piVar2);
    *piVar2 = -1;
    local_18 = local_18 + 1;
  }
  vec<int,_int>::clear(&this->heap,dispose);
  return;
}

Assistant:

void clear(bool dispose = false) 
    { 
        // TODO: shouldn't the 'indices' map also be dispose-cleared?
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dispose); 
    }